

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SynthRoute.cpp
# Opt level: O0

void __thiscall SynthRoute::disableExclusiveMidiMode(SynthRoute *this)

{
  bool bVar1;
  MidiSession **ppMVar2;
  QMessageLogger local_40;
  QDebug local_20;
  MidiSession *local_18;
  MidiSession *midiSession;
  SynthRoute *this_local;
  
  if (((this->exclusiveMidiMode & 1U) != 0) &&
     (midiSession = (MidiSession *)this, bVar1 = hasMIDISessions(this), bVar1)) {
    ppMVar2 = QList<MidiSession_*>::first(&this->midiSessions);
    local_18 = *ppMVar2;
    removeMidiSession(this,local_18);
    this->exclusiveMidiMode = false;
    QMessageLogger::QMessageLogger(&local_40,(char *)0x0,0,(char *)0x0);
    QMessageLogger::debug();
    QDebug::operator<<(&local_20,"SynthRoute: exclusiveMidiMode disabled");
    QDebug::~QDebug(&local_20);
    exclusiveMidiSessionRemoved(this,local_18);
  }
  return;
}

Assistant:

void SynthRoute::disableExclusiveMidiMode() {
	if (exclusiveMidiMode && hasMIDISessions()) {
		MidiSession *midiSession = midiSessions.first();
		removeMidiSession(midiSession);
		exclusiveMidiMode = false;
		qDebug() << "SynthRoute: exclusiveMidiMode disabled";
		emit exclusiveMidiSessionRemoved(midiSession);
	}
}